

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_doors.cpp
# Opt level: O3

bool __thiscall DAnimatedDoor::StartClosing(DAnimatedDoor *this)

{
  uint32_t *puVar1;
  double dest;
  sector_t_conflict *this_00;
  EMoveResult EVar2;
  bool bVar3;
  FName local_14;
  
  this_00 = (this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector;
  if (this_00->touching_thinglist == (msecnode_t *)0x0) {
    dest = (this_00->ceilingplane).D;
    bVar3 = false;
    EVar2 = sector_t::MoveCeiling((sector_t *)this_00,2048.0,this->m_BotDist,0,-1,false);
    if (EVar2 != crushed) {
      sector_t::MoveCeiling
                ((sector_t *)(this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector,
                 2048.0,dest,-1,1,false);
      puVar1 = &this->m_Line1->flags;
      *puVar1 = *puVar1 | 1;
      puVar1 = &this->m_Line2->flags;
      *puVar1 = *puVar1 | 1;
      local_14.Index = (this->m_DoorAnim->CloseSound).Index;
      if (local_14.Index != 0) {
        SN_StartSequence((sector_t *)
                         (this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector,2,
                         &local_14,1);
      }
      this->m_Status = 2;
      this->m_Timer = this->m_Speed;
      bVar3 = true;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool DAnimatedDoor::StartClosing ()
{
	// CAN DOOR CLOSE?
	if (m_Sector->touching_thinglist != NULL)
	{
		return false;
	}

	double topdist = m_Sector->ceilingplane.fD();
	if (m_Sector->MoveCeiling (2048., m_BotDist, 0, -1, false) == EMoveResult::crushed)
	{
		return false;
	}

	m_Sector->MoveCeiling (2048., topdist, 1);

	m_Line1->flags |= ML_BLOCKING;
	m_Line2->flags |= ML_BLOCKING;
	if (m_DoorAnim->CloseSound != NAME_None)
	{
		SN_StartSequence (m_Sector, CHAN_CEILING, m_DoorAnim->CloseSound, 1);
	}

	m_Status = Closing;
	m_Timer = m_Speed;
	return true;
}